

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.cc
# Opt level: O2

void testing::internal::InitGoogleMockImpl<wchar_t>(int *argc,wchar_t **argv)

{
  _Alloc_hider str;
  bool bVar1;
  int iVar2;
  wchar_t **extraout_RDX;
  wchar_t **streamable;
  bool *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_00;
  int32_t *value_01;
  wchar_t **extraout_RDX_00;
  int iVar3;
  internal *this;
  long lVar4;
  string arg_string;
  
  InitGoogleTest(argc,argv);
  iVar2 = *argc;
  if (0 < iVar2) {
    streamable = extraout_RDX;
    for (iVar3 = 1; iVar3 != iVar2; iVar3 = iVar3 + 1) {
      lVar4 = (long)iVar3;
      this = (internal *)(argv + lVar4);
      StreamableToString<wchar_t*>(&arg_string,this,streamable);
      str = arg_string._M_dataplus;
      bVar1 = ParseGoogleMockBoolFlag(arg_string._M_dataplus._M_p,(char *)this,value);
      if (bVar1) {
LAB_00133d9e:
        iVar2 = *argc;
        for (; iVar2 != lVar4; lVar4 = lVar4 + 1) {
          argv[lVar4] = argv[lVar4 + 1];
        }
        *argc = iVar2 + -1;
        iVar3 = iVar3 + -1;
      }
      else {
        bVar1 = ParseGoogleMockStringFlag<std::__cxx11::string>(str._M_p,(char *)this,value_00);
        if (bVar1) goto LAB_00133d9e;
        bVar1 = ParseGoogleMockIntFlag(str._M_p,(char *)this,value_01);
        if (bVar1) goto LAB_00133d9e;
      }
      std::__cxx11::string::~string((string *)&arg_string);
      iVar2 = *argc;
      streamable = extraout_RDX_00;
    }
  }
  return;
}

Assistant:

void InitGoogleMockImpl(int* argc, CharType** argv) {
  // Makes sure Google Test is initialized.  InitGoogleTest() is
  // idempotent, so it's fine if the user has already called it.
  InitGoogleTest(argc, argv);
  if (*argc <= 0) return;

  for (int i = 1; i != *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    // Do we see a Google Mock flag?
    if (ParseGoogleMockBoolFlag(arg, "catch_leaked_mocks",
                                &GMOCK_FLAG(catch_leaked_mocks)) ||
        ParseGoogleMockStringFlag(arg, "verbose", &GMOCK_FLAG(verbose)) ||
        ParseGoogleMockIntFlag(arg, "default_mock_behavior",
                               &GMOCK_FLAG(default_mock_behavior))) {
      // Yes.  Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    }
  }
}